

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall
Minisat::Solver::implies(Solver *this,vec<Minisat::Lit,_int> *assumps,vec<Minisat::Lit,_int> *out)

{
  int iVar1;
  bool bVar2;
  Size SVar3;
  CRef CVar4;
  Lit *pLVar5;
  int local_58;
  int j;
  bool ret;
  uint trail_before;
  lbool local_3e;
  uint8_t local_3d;
  int local_3c;
  lbool local_35;
  Lit local_34;
  int local_30;
  Lit a;
  int i;
  vec<Minisat::Lit,_int> *out_local;
  vec<Minisat::Lit,_int> *assumps_local;
  Solver *this_local;
  
  a.x = vec<Minisat::Lit,_int>::size(&this->trail);
  vec<int,_int>::push(&this->trail_lim,&a.x);
  local_30 = 0;
  while( true ) {
    iVar1 = local_30;
    SVar3 = vec<Minisat::Lit,_int>::size(assumps);
    if (SVar3 <= iVar1) {
      local_58 = vec<Minisat::Lit,_int>::size(&this->trail);
      bVar2 = true;
      CVar4 = propagate(this);
      if (CVar4 == 0xffffffff) {
        vec<Minisat::Lit,_int>::clear(out,false);
        for (; SVar3 = vec<Minisat::Lit,_int>::size(&this->trail), local_58 < SVar3;
            local_58 = local_58 + 1) {
          pLVar5 = vec<Minisat::Lit,_int>::operator[](&this->trail,local_58);
          vec<Minisat::Lit,_int>::push(out,pLVar5);
        }
      }
      else {
        bVar2 = false;
      }
      cancelUntil(this,0);
      return bVar2;
    }
    pLVar5 = vec<Minisat::Lit,_int>::operator[](assumps,local_30);
    local_3c = pLVar5->x;
    local_34.x = local_3c;
    local_35 = value(this,(Lit)local_3c);
    local_3d = l_False.value;
    bVar2 = lbool::operator==(&local_35,l_False);
    if (bVar2) break;
    local_3e = value(this,local_34);
    bVar2 = lbool::operator==(&local_3e,l_Undef);
    if (bVar2) {
      uncheckedEnqueue(this,local_34,0xffffffff);
    }
    local_30 = local_30 + 1;
  }
  cancelUntil(this,0);
  return false;
}

Assistant:

bool Solver::implies(const vec<Lit>& assumps, vec<Lit>& out)
{
    trail_lim.push(trail.size());
    for (int i = 0; i < assumps.size(); i++){
        Lit a = assumps[i];

        if (value(a) == l_False){
            cancelUntil(0);
            return false;
        }else if (value(a) == l_Undef)
            uncheckedEnqueue(a);
    }

    unsigned trail_before = trail.size();
    bool     ret          = true;
    if (propagate() == CRef_Undef){
        out.clear();
        for (int j = trail_before; j < trail.size(); j++)
            out.push(trail[j]);
    }else
        ret = false;
    
    cancelUntil(0);
    return ret;
}